

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_yangver(lysp_ctx *ctx,lysp_stmt *stmt,uint8_t *version,lysp_ext_instance **exts)

{
  uint8_t uVar1;
  int iVar2;
  LY_ERR LVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  ly_ctx *plVar7;
  lysp_stmt *stmt_00;
  
  if (*version == '\0') {
    pcVar5 = stmt->arg;
    if ((*pcVar5 == '1') && (pcVar5[1] == '\0')) {
      uVar1 = '\x01';
    }
    else {
      iVar2 = strcmp(pcVar5,"1.1");
      if (iVar2 != 0) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        sVar4 = strlen(pcVar5);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                sVar4 & 0xffffffff,pcVar5,"yang-version");
        goto LAB_0016f856;
      }
      uVar1 = '\x02';
    }
    *version = uVar1;
    for (stmt_00 = stmt->child; stmt_00 != (lysp_stmt *)0x0; stmt_00 = stmt_00->next) {
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(stmt_00->kw);
        pcVar6 = lyplg_ext_stmt2str(LY_STMT_YANG_VERSION);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar5,pcVar6);
        goto LAB_0016f856;
      }
      LVar3 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,0,(lysp_ext_instance **)0x0);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    LVar3 = LY_SUCCESS;
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","yin-element");
LAB_0016f856:
    LVar3 = LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_yangver(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint8_t *version, struct lysp_ext_instance **exts)
{
    if (*version) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "yin-element");
        return LY_EVALID;
    }

    /* store flag */
    if (!strcmp(stmt->arg, "1")) {
        *version = LYS_VERSION_1_0;
    } else if (!strcmp(stmt->arg, "1.1")) {
        *version = LYS_VERSION_1_1;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)strlen(stmt->arg), stmt->arg, "yang-version");
        return LY_EVALID;
    }

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_YANG_VERSION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}